

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::
InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
::operator()(InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
             *this,InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                   *in1,
            InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *in2)

{
  bool bVar1;
  InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *in2_local;
  InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *in1_local;
  InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
  *this_local;
  
  bVar1 = inputLess<tcu::Vector<float,4>>((Vector<float,_4> *)in1,(Vector<float,_4> *)in2);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = inputLess<tcu::Vector<float,4>>((Vector<float,_4> *)in2,(Vector<float,_4> *)in1);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = inputLess<vkt::shaderexecutor::Void>
                        ((Void *)&(in1->
                                  super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                  ).field_0x10,
                         (Void *)&(in2->
                                  super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                  ).field_0x10);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = inputLess<vkt::shaderexecutor::Void>
                          ((Void *)&(in2->
                                    super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                    ).field_0x10,
                           (Void *)&(in1->
                                    super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                    ).field_0x10);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          bVar1 = inputLess<vkt::shaderexecutor::Void>
                            ((Void *)&(in1->
                                      super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                      ).field_0x11,
                             (Void *)&(in2->
                                      super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                      ).field_0x11);
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            bVar1 = inputLess<vkt::shaderexecutor::Void>
                              ((Void *)&(in2->
                                        super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                        ).field_0x11,
                               (Void *)&(in1->
                                        super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                        ).field_0x11);
            if (bVar1) {
              this_local._7_1_ = false;
            }
            else {
              bVar1 = inputLess<vkt::shaderexecutor::Void>
                                ((Void *)&(in1->
                                          super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                          ).field_0x12,
                                 (Void *)&(in2->
                                          super_Tuple4<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                                          ).field_0x12);
              if (bVar1) {
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}